

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::RecordAllStringTemplateCallsiteConstants
          (ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  int iVar1;
  Type pSVar2;
  ParseNode *this_00;
  ParseNode *pPVar3;
  uint uVar4;
  RegSlot RVar5;
  FuncInfo *this_01;
  FunctionBody *this_02;
  ScriptContext *scriptContext;
  ParseNodeStrTemplate *pPVar6;
  JavascriptArray *pJVar7;
  JavascriptArray *var;
  ulong uVar8;
  int iVar9;
  
  this_01 = TopFuncInfo(this);
  this_02 = FuncInfo::GetParsedFunctionBody(this_01);
  uVar4 = (funcInfo->stringTemplateCallsiteRegisterMap).bucketCount;
  if (uVar4 != 0) {
    uVar8 = 0;
    do {
      iVar9 = (funcInfo->stringTemplateCallsiteRegisterMap).buckets[uVar8];
      if (iVar9 != -1) {
        do {
          pSVar2 = (funcInfo->stringTemplateCallsiteRegisterMap).entries;
          RVar5 = pSVar2[iVar9].
                  super_DefaultHashedEntry<ParseNode_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<ParseNode_*,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>.value;
          iVar1 = pSVar2[iVar9].
                  super_DefaultHashedEntry<ParseNode_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<ParseNode_*,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>.next;
          this_00 = pSVar2[iVar9].
                    super_DefaultHashedEntry<ParseNode_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<ParseNode_*,_unsigned_int>.
                    super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>_>
                    .super_KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>.key;
          scriptContext = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this_02);
          pPVar6 = ParseNode::AsParseNodeStrTemplate(this_00);
          pPVar3 = pPVar6->pnodeStringRawLiterals;
          pPVar6 = ParseNode::AsParseNodeStrTemplate(this_00);
          pJVar7 = BuildArrayFromStringList(pPVar3,(uint)pPVar6->countStringLiterals,scriptContext);
          (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x38])
                    (pJVar7);
          pPVar6 = ParseNode::AsParseNodeStrTemplate(this_00);
          pPVar3 = pPVar6->pnodeStringLiterals;
          pPVar6 = ParseNode::AsParseNodeStrTemplate(this_00);
          var = BuildArrayFromStringList(pPVar3,(uint)pPVar6->countStringLiterals,scriptContext);
          (*(var->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
                    (var,0x12a,pJVar7,0,0,0,0xf);
          (*(var->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x38])
                    (var);
          RVar5 = Js::FunctionBody::MapRegSlot(this_02,RVar5);
          Js::FunctionBody::RecordConstant(this_02,RVar5,var);
          iVar9 = iVar1;
        } while (iVar1 != -1);
        uVar4 = (funcInfo->stringTemplateCallsiteRegisterMap).bucketCount;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar4);
  }
  return;
}

Assistant:

void ByteCodeGenerator::RecordAllStringTemplateCallsiteConstants(FuncInfo* funcInfo)
{
    Js::FunctionBody *byteCodeFunction = this->TopFuncInfo()->GetParsedFunctionBody();
    funcInfo->stringTemplateCallsiteRegisterMap.Map([byteCodeFunction](ParseNodePtr pnode, Js::RegSlot location)
    {
        Js::ScriptContext* scriptContext = byteCodeFunction->GetScriptContext();
        
        Js::RecyclableObject* rawArray = ByteCodeGenerator::BuildArrayFromStringList(pnode->AsParseNodeStrTemplate()->pnodeStringRawLiterals, pnode->AsParseNodeStrTemplate()->countStringLiterals, scriptContext);
        rawArray->Freeze();

        Js::RecyclableObject* callsiteObject = ByteCodeGenerator::BuildArrayFromStringList(pnode->AsParseNodeStrTemplate()->pnodeStringLiterals, pnode->AsParseNodeStrTemplate()->countStringLiterals, scriptContext);
        callsiteObject->SetPropertyWithAttributes(Js::PropertyIds::raw, rawArray, PropertyNone, nullptr);
        callsiteObject->Freeze();

        byteCodeFunction->RecordConstant(byteCodeFunction->MapRegSlot(location), callsiteObject);
    });
}